

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

CustomLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_custom(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 500) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 500;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x60);
    CustomLayerParams::CustomLayerParams(this_00.custom_);
    (this->layer_).custom_ = (CustomLayerParams *)this_00;
  }
  return (CustomLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::CustomLayerParams* NeuralNetworkLayer::mutable_custom() {
  if (!has_custom()) {
    clear_layer();
    set_has_custom();
    layer_.custom_ = new ::CoreML::Specification::CustomLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.custom)
  return layer_.custom_;
}